

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_module(char *module)

{
  int iVar1;
  
  iVar1 = strcmp(module,"HTMLparser");
  if (iVar1 == 0) {
    iVar1 = test_HTMLparser();
    return iVar1;
  }
  iVar1 = strcmp(module,"HTMLtree");
  if (iVar1 == 0) {
    iVar1 = test_HTMLtree();
    return iVar1;
  }
  iVar1 = strcmp(module,"SAX2");
  if (iVar1 == 0) {
    iVar1 = test_SAX2();
    return iVar1;
  }
  iVar1 = strcmp(module,"c14n");
  if (iVar1 == 0) {
    iVar1 = test_c14n();
    return iVar1;
  }
  iVar1 = strcmp(module,"catalog");
  if (iVar1 == 0) {
    iVar1 = test_catalog();
    return iVar1;
  }
  iVar1 = strcmp(module,"chvalid");
  if (iVar1 == 0) {
    iVar1 = test_chvalid();
    return iVar1;
  }
  iVar1 = strcmp(module,"debugXML");
  if (iVar1 == 0) {
    iVar1 = test_debugXML();
    return iVar1;
  }
  iVar1 = strcmp(module,"dict");
  if (iVar1 == 0) {
    iVar1 = test_dict();
    return iVar1;
  }
  iVar1 = strcmp(module,"encoding");
  if (iVar1 == 0) {
    iVar1 = test_encoding();
    return iVar1;
  }
  iVar1 = strcmp(module,"entities");
  if (iVar1 == 0) {
    iVar1 = test_entities();
    return iVar1;
  }
  iVar1 = strcmp(module,"hash");
  if (iVar1 == 0) {
    iVar1 = test_hash();
    return iVar1;
  }
  iVar1 = strcmp(module,"list");
  if (iVar1 == 0) {
    iVar1 = test_list();
    return iVar1;
  }
  iVar1 = strcmp(module,"nanoftp");
  if (iVar1 == 0) {
    iVar1 = test_nanoftp();
    return iVar1;
  }
  iVar1 = strcmp(module,"nanohttp");
  if (iVar1 == 0) {
    iVar1 = test_nanohttp();
    return iVar1;
  }
  iVar1 = strcmp(module,"parser");
  if (iVar1 == 0) {
    iVar1 = test_parser();
    return iVar1;
  }
  iVar1 = strcmp(module,"parserInternals");
  if (iVar1 == 0) {
    iVar1 = test_parserInternals();
    return iVar1;
  }
  iVar1 = strcmp(module,"pattern");
  if (iVar1 == 0) {
    iVar1 = test_pattern();
    return iVar1;
  }
  iVar1 = strcmp(module,"relaxng");
  if (iVar1 == 0) {
    iVar1 = test_relaxng();
    return iVar1;
  }
  iVar1 = strcmp(module,"schemasInternals");
  if (iVar1 == 0) {
    if (quiet == '\0') {
      puts("Testing schemasInternals : 0 of 2 functions ...");
    }
  }
  else {
    iVar1 = strcmp(module,"schematron");
    if (iVar1 == 0) {
      iVar1 = test_schematron();
      return iVar1;
    }
    iVar1 = strcmp(module,"tree");
    if (iVar1 == 0) {
      iVar1 = test_tree();
      return iVar1;
    }
    iVar1 = strcmp(module,"uri");
    if (iVar1 == 0) {
      iVar1 = test_uri();
      return iVar1;
    }
    iVar1 = strcmp(module,"valid");
    if (iVar1 == 0) {
      iVar1 = test_valid();
      return iVar1;
    }
    iVar1 = strcmp(module,"xinclude");
    if (iVar1 == 0) {
      iVar1 = test_xinclude();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlIO");
    if (iVar1 == 0) {
      iVar1 = test_xmlIO();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlautomata");
    if (iVar1 == 0) {
      iVar1 = test_xmlautomata();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlerror");
    if (iVar1 == 0) {
      iVar1 = test_xmlerror();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlmodule");
    if (iVar1 == 0) {
      iVar1 = test_xmlmodule();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlreader");
    if (iVar1 == 0) {
      iVar1 = test_xmlreader();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlregexp");
    if (iVar1 == 0) {
      iVar1 = test_xmlregexp();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlsave");
    if (iVar1 == 0) {
      iVar1 = test_xmlsave();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlschemas");
    if (iVar1 == 0) {
      iVar1 = test_xmlschemas();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlschemastypes");
    if (iVar1 == 0) {
      iVar1 = test_xmlschemastypes();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlstring");
    if (iVar1 == 0) {
      iVar1 = test_xmlstring();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlunicode");
    if (iVar1 == 0) {
      iVar1 = test_xmlunicode();
      return iVar1;
    }
    iVar1 = strcmp(module,"xmlwriter");
    if (iVar1 == 0) {
      iVar1 = test_xmlwriter();
      return iVar1;
    }
    iVar1 = strcmp(module,"xpath");
    if (iVar1 == 0) {
      iVar1 = test_xpath();
      return iVar1;
    }
    iVar1 = strcmp(module,"xpathInternals");
    if (iVar1 == 0) {
      iVar1 = test_xpathInternals();
      return iVar1;
    }
    iVar1 = strcmp(module,"xpointer");
    if (iVar1 == 0) {
      iVar1 = test_xpointer();
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int
test_module(const char *module) {
    if (!strcmp(module, "HTMLparser")) return(test_HTMLparser());
    if (!strcmp(module, "HTMLtree")) return(test_HTMLtree());
    if (!strcmp(module, "SAX2")) return(test_SAX2());
    if (!strcmp(module, "c14n")) return(test_c14n());
    if (!strcmp(module, "catalog")) return(test_catalog());
    if (!strcmp(module, "chvalid")) return(test_chvalid());
    if (!strcmp(module, "debugXML")) return(test_debugXML());
    if (!strcmp(module, "dict")) return(test_dict());
    if (!strcmp(module, "encoding")) return(test_encoding());
    if (!strcmp(module, "entities")) return(test_entities());
    if (!strcmp(module, "hash")) return(test_hash());
    if (!strcmp(module, "list")) return(test_list());
    if (!strcmp(module, "nanoftp")) return(test_nanoftp());
    if (!strcmp(module, "nanohttp")) return(test_nanohttp());
    if (!strcmp(module, "parser")) return(test_parser());
    if (!strcmp(module, "parserInternals")) return(test_parserInternals());
    if (!strcmp(module, "pattern")) return(test_pattern());
    if (!strcmp(module, "relaxng")) return(test_relaxng());
    if (!strcmp(module, "schemasInternals")) return(test_schemasInternals());
    if (!strcmp(module, "schematron")) return(test_schematron());
    if (!strcmp(module, "tree")) return(test_tree());
    if (!strcmp(module, "uri")) return(test_uri());
    if (!strcmp(module, "valid")) return(test_valid());
    if (!strcmp(module, "xinclude")) return(test_xinclude());
    if (!strcmp(module, "xmlIO")) return(test_xmlIO());
    if (!strcmp(module, "xmlautomata")) return(test_xmlautomata());
    if (!strcmp(module, "xmlerror")) return(test_xmlerror());
    if (!strcmp(module, "xmlmodule")) return(test_xmlmodule());
    if (!strcmp(module, "xmlreader")) return(test_xmlreader());
    if (!strcmp(module, "xmlregexp")) return(test_xmlregexp());
    if (!strcmp(module, "xmlsave")) return(test_xmlsave());
    if (!strcmp(module, "xmlschemas")) return(test_xmlschemas());
    if (!strcmp(module, "xmlschemastypes")) return(test_xmlschemastypes());
    if (!strcmp(module, "xmlstring")) return(test_xmlstring());
    if (!strcmp(module, "xmlunicode")) return(test_xmlunicode());
    if (!strcmp(module, "xmlwriter")) return(test_xmlwriter());
    if (!strcmp(module, "xpath")) return(test_xpath());
    if (!strcmp(module, "xpathInternals")) return(test_xpathInternals());
    if (!strcmp(module, "xpointer")) return(test_xpointer());
    return(0);
}